

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O1

void close_state(lua_State *L)

{
  size_t *psVar1;
  byte bVar2;
  uint32_t uVar3;
  GCRef *pGVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  global_State *g;
  
  g = (global_State *)(ulong)(L->glref).ptr32;
  lj_func_closeuv(L,(TValue *)(ulong)(L->stack).ptr32);
  lj_gc_freeall(g);
  lj_trace_freestate(g);
  lj_ctype_freestate(g);
  pGVar4 = g->strhash;
  sVar7 = (ulong)(g->strmask + 1) * 4;
  (g->gc).total = (g->gc).total - (int)sVar7;
  psVar1 = &(g->gc).freed;
  *psVar1 = *psVar1 + sVar7;
  (*g->allocf)(g->allocd,pGVar4,sVar7,0);
  uVar3 = (g->tmpbuf).b.ptr32;
  uVar6 = (g->tmpbuf).e.ptr32 - uVar3;
  (g->gc).total = (g->gc).total - uVar6;
  psVar1 = &(g->gc).freed;
  *psVar1 = *psVar1 + (ulong)uVar6;
  (*g->allocf)(g->allocd,(void *)uVar3,(ulong)uVar6,0);
  uVar3 = (L->stack).ptr32;
  sVar7 = (ulong)L->stacksize * 8;
  (g->gc).total = (g->gc).total - (int)sVar7;
  psVar1 = &(g->gc).freed;
  *psVar1 = *psVar1 + sVar7;
  (*g->allocf)(g->allocd,(void *)uVar3,sVar7,0);
  uVar3 = (g->gc).lightudseg.ptr32;
  if (uVar3 != 0) {
    bVar2 = (g->gc).lightudnum;
    iVar5 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    sVar7 = 8;
    if (bVar2 != 0) {
      sVar7 = (ulong)(uint)(2 << ((byte)iVar5 & 0x1f)) << 2;
    }
    (g->gc).total = (g->gc).total - (int)sVar7;
    psVar1 = &(g->gc).freed;
    *psVar1 = *psVar1 + sVar7;
    (*g->allocf)(g->allocd,(void *)uVar3,sVar7,0);
  }
  if (g->allocf != lj_alloc_f) {
    (*g->allocf)(g->allocd,g[-1].gcroot + 0x1c,0x15a8,0);
    return;
  }
  lj_alloc_destroy(g->allocd);
  return;
}

Assistant:

static void close_state(lua_State *L)
{
  global_State *g = G(L);
  lj_func_closeuv(L, tvref(L->stack));
  lj_gc_freeall(g);
  lj_assertG(gcref(g->gc.root) == obj2gco(L),
	     "main thread is not first GC object");
  lj_assertG(g->strnum == 0, "leaked %d strings", g->strnum);
  lj_trace_freestate(g);
#if LJ_HASFFI
  lj_ctype_freestate(g);
#endif
  lj_mem_freevec(g, g->strhash, g->strmask+1, GCRef);
  lj_buf_free(g, &g->tmpbuf);
  lj_mem_freevec(g, tvref(L->stack), L->stacksize, TValue);
#if LJ_64
  if (mref(g->gc.lightudseg, uint32_t)) {
    MSize segnum = g->gc.lightudnum ? (2 << lj_fls(g->gc.lightudnum)) : 2;
    lj_mem_freevec(g, mref(g->gc.lightudseg, uint32_t), segnum, uint32_t);
  }
#endif
  lj_assertG(g->gc.total == sizeof(GG_State),
	     "memory leak of %lld bytes",
	     (long long)(g->gc.total - sizeof(GG_State)));
#ifndef LUAJIT_USE_SYSMALLOC
  if (g->allocf == lj_alloc_f)
    lj_alloc_destroy(g->allocd);
  else
#endif
    g->allocf(g->allocd, G2GG(g), sizeof(GG_State), 0);
}